

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

InternalParseResult * __thiscall
Catch::Clara::Parser::parse
          (InternalParseResult *__return_storage_ptr__,Parser *this,string *exeName,
          TokenStream *tokens)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pOVar2;
  ulong uVar3;
  ParserBase *pPVar4;
  bool bVar5;
  pointer pPVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar8;
  size_type in_R9;
  uint uVar9;
  _Vector_base<ParserInfo,_std::allocator<ParserInfo>_> *this_00;
  Opt *opt;
  pointer pOVar10;
  pointer pPVar11;
  StringRef lhs;
  StringRef rhs;
  vector<ParserInfo,_std::allocator<ParserInfo>_> parseInfos;
  value_type local_180;
  ParseResultType local_170;
  StringRef *local_168;
  StringRef *pSStack_160;
  pointer local_158;
  pointer pTStack_150;
  pointer local_148;
  char *local_140;
  size_type local_138;
  char local_130;
  undefined7 uStack_12f;
  undefined8 uStack_128;
  uint local_11c;
  vector<ParserInfo,_std::allocator<ParserInfo>_> local_118;
  string *local_f8;
  TokenStream *local_f0;
  string local_e8;
  StringRef *pSStack_c8;
  pointer local_c0;
  pointer pTStack_b8;
  pointer local_b0;
  long *local_a8 [2];
  long local_98 [2];
  StringRef *local_88;
  StringRef *pSStack_80;
  pointer local_78;
  pointer pTStack_70;
  pointer local_68;
  ParserResult local_60;
  
  local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (_Vector_base<ParserInfo,_std::allocator<ParserInfo>_> *)
            (((long)(this->m_args).
                    super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_args).
                    super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 6) +
            ((long)(this->m_options).
                   super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(this->m_options).
                   super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3);
  local_f8 = exeName;
  if ((ulong)this_00 >> 0x3b != 0) {
    std::__throw_length_error("vector::reserve");
  }
  if (this_00 != (_Vector_base<ParserInfo,_std::allocator<ParserInfo>_> *)0x0) {
    local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
    super__Vector_impl_data._M_finish =
         std::_Vector_base<ParserInfo,_std::allocator<ParserInfo>_>::_M_allocate
                   (this_00,(size_t)this);
    local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
         super__Vector_impl_data._M_finish + (long)this_00;
  }
  pOVar10 = (this->m_options).
            super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar2 = (this->m_options).
           super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (pOVar10 != pOVar2) {
    do {
      local_180.count = 0;
      local_180.parser = (ParserBase *)pOVar10;
      std::vector<ParserInfo,_std::allocator<ParserInfo>_>::push_back(&local_118,&local_180);
      pOVar10 = pOVar10 + 1;
    } while (pOVar10 != pOVar2);
  }
  pOVar10 = (pointer)(this->m_args).
                     super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
                     _M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (pointer)(this->m_args).
                    super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
  if (pOVar10 != pOVar2) {
    do {
      local_180.count = 0;
      local_180.parser = (ParserBase *)pOVar10;
      std::vector<ParserInfo,_std::allocator<ParserInfo>_>::push_back(&local_118,&local_180);
      pOVar10 = (pointer)&pOVar10->m_optNames;
    } while (pOVar10 != pOVar2);
  }
  ExeName::set(&local_60,&this->m_exeName,local_f8);
  local_60.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001b2540;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.m_errorMessage._M_dataplus._M_p != &local_60.m_errorMessage.field_2) {
    operator_delete(local_60.m_errorMessage._M_dataplus._M_p,
                    local_60.m_errorMessage.field_2._M_allocated_capacity + 1);
  }
  local_60.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__ResultValueBase_001b2598;
  local_148 = (tokens->m_tokenBuffer).
              super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_158 = (tokens->m_tokenBuffer).
              super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pTStack_150 = (tokens->m_tokenBuffer).
                super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (tokens->m_tokenBuffer).
  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180.count = local_180.count & 0xffffffff00000000;
  local_170 = NoMatch;
  local_168 = (tokens->it)._M_current;
  pSStack_160 = (tokens->itEnd)._M_current;
  local_180.parser = (ParserBase *)&PTR__BasicResult_001b2450;
  local_138 = 0;
  local_130 = '\0';
  paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
  local_f0 = &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
              field_0.m_value.m_remainingTokens;
  local_140 = &local_130;
  do {
    (*(code *)local_180.parser[2]._vptr_ParserBase)(&local_180);
    pPVar6 = local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((local_158 == pTStack_150) && (local_168 == pSStack_160)) {
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultBase_001afe98;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase.m_type = (ResultType)local_180.count;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001b24a8;
      if ((ResultType)local_180.count == Ok) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_type = local_170;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current = local_168;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current = pSStack_160;
        *(pointer *)
         ((long)&(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
                 field_0 + 0x18) = local_158;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.m_tokenBuffer.
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_finish = pTStack_150;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.m_tokenBuffer.
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_148;
        local_158 = (pointer)0x0;
        pTStack_150 = (pointer)0x0;
        local_148 = (pointer)0x0;
      }
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2450;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
      if (local_140 == &local_130) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_12f,local_130);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_128;
      }
      else {
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_140;
        (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
             CONCAT71(uStack_12f,local_130);
      }
      (__return_storage_ptr__->m_errorMessage)._M_string_length = local_138;
      local_138 = 0;
      local_130 = '\0';
      local_140 = &local_130;
      break;
    }
    if (local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar7 = 8;
      uVar9 = 0;
    }
    else {
      local_11c = 0;
      pPVar11 = local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar7 = (*pPVar11->parser->_vptr_ParserBase[4])();
        if ((CONCAT44(extraout_var,iVar7) == 0) ||
           (uVar3 = pPVar11->count, iVar7 = (*pPVar11->parser->_vptr_ParserBase[4])(),
           uVar3 < CONCAT44(extraout_var_00,iVar7))) {
          pPVar4 = pPVar11->parser;
          (*(code *)local_180.parser[2]._vptr_ParserBase)(&local_180);
          local_88 = local_168;
          pSStack_80 = pSStack_160;
          local_78 = local_158;
          pTStack_70 = pTStack_150;
          local_68 = local_148;
          local_158 = (pointer)0x0;
          pTStack_150 = (pointer)0x0;
          local_148 = (pointer)0x0;
          (*pPVar4->_vptr_ParserBase[3])(&local_e8,pPVar4,local_f8);
          if (((ResultType)local_180.count == 0) && (local_158 != (pointer)0x0)) {
            operator_delete(local_158,(long)local_148 - (long)local_158);
          }
          local_180.count = CONCAT44(local_180.count._4_4_,(int)local_e8._M_string_length);
          if ((int)local_e8._M_string_length == 0) {
            local_170 = local_e8.field_2._M_allocated_capacity._0_4_;
            local_168 = (StringRef *)local_e8.field_2._8_8_;
            pSStack_160 = pSStack_c8;
            local_158 = local_c0;
            pTStack_150 = pTStack_b8;
            local_148 = local_b0;
            local_c0 = (pointer)0x0;
            pTStack_b8 = (pointer)0x0;
            local_b0 = (pointer)0x0;
          }
          std::__cxx11::string::operator=((string *)&local_140,(string *)local_a8);
          local_e8._M_dataplus._M_p = (pointer)&PTR__BasicResult_001b2450;
          if (local_a8[0] != local_98) {
            operator_delete(local_a8[0],local_98[0] + 1);
          }
          local_e8._M_dataplus._M_p = (pointer)&PTR__ResultValueBase_001b24a8;
          if (((int)local_e8._M_string_length == 0) && (local_c0 != (pointer)0x0)) {
            operator_delete(local_c0,(long)local_b0 - (long)local_c0);
          }
          if (local_78 != (pointer)0x0) {
            operator_delete(local_78,(long)local_68 - (long)local_78);
          }
          if ((ResultType)local_180.count == Ok) {
            uVar8 = (*(code *)local_180.parser[2]._vptr_ParserBase)(&local_180);
            if (local_170 == NoMatch) goto LAB_00145299;
            pPVar11->count = pPVar11->count + 1;
            local_11c = (uint)CONCAT71((int7)((ulong)uVar8 >> 8),1);
            iVar7 = 8;
          }
          else {
            (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
            super_ResultBase.m_type = (ResultType)local_180.count;
            (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
            super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2450;
            (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
            if (local_140 == &local_130) {
              paVar1->_M_allocated_capacity = CONCAT71(uStack_12f,local_130);
              *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) =
                   uStack_128;
            }
            else {
              (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_140;
              (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
                   CONCAT71(uStack_12f,local_130);
            }
            (__return_storage_ptr__->m_errorMessage)._M_string_length = local_138;
            local_138 = 0;
            local_130 = '\0';
            iVar7 = 1;
            local_140 = &local_130;
          }
          bVar5 = false;
        }
        else {
LAB_00145299:
          iVar7 = 0;
          bVar5 = true;
        }
        uVar9 = local_11c;
        if (!bVar5) goto LAB_001452fe;
        pPVar11 = pPVar11 + 1;
      } while (pPVar11 != pPVar6);
      iVar7 = 8;
    }
LAB_001452fe:
    if (iVar7 == 8) {
      (*(code *)local_180.parser[2]._vptr_ParserBase)(&local_180);
      if (local_170 == ShortCircuitAll) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultBase_001afe98;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
        super_ResultBase.m_type = (ResultType)local_180.count;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001b24a8;
        if ((ResultType)local_180.count == Ok) {
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
          m_value.m_type = ShortCircuitAll;
          (local_f0->it)._M_current = local_168;
          (local_f0->itEnd)._M_current = pSStack_160;
          *(pointer *)
           ((long)&(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>)
                   .field_0 + 0x18) = local_158;
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
          m_value.m_remainingTokens.m_tokenBuffer.
          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_finish = pTStack_150;
          (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
          m_value.m_remainingTokens.m_tokenBuffer.
          super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_148;
          local_158 = (pointer)0x0;
          pTStack_150 = (pointer)0x0;
          local_148 = (pointer)0x0;
        }
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2450;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
        if (local_140 == &local_130) {
          paVar1->_M_allocated_capacity = CONCAT71(uStack_12f,local_130);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_128;
        }
        else {
          (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_140;
          (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
               CONCAT71(uStack_12f,local_130);
        }
        (__return_storage_ptr__->m_errorMessage)._M_string_length = local_138;
        local_138 = 0;
        local_130 = '\0';
        local_140 = &local_130;
      }
      else {
        iVar7 = 0;
        if ((uVar9 & 1) != 0) goto LAB_00145470;
        (*(code *)local_180.parser[2]._vptr_ParserBase)(&local_180);
        lhs.m_size = (size_type)(local_158->token).m_start;
        lhs.m_start = (char *)0x14;
        rhs.m_size = in_R9;
        rhs.m_start = (char *)(local_158->token).m_size;
        operator+[abi_cxx11_(&local_e8,(Catch *)"Unrecognised token: ",lhs,rhs);
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
        super_ResultBase.m_type = RuntimeError;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2450;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
          paVar1->_M_allocated_capacity =
               CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                        local_e8.field_2._M_allocated_capacity._0_4_);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) =
               local_e8.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_e8._M_dataplus._M_p;
          (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
               CONCAT44(local_e8.field_2._M_allocated_capacity._4_4_,
                        local_e8.field_2._M_allocated_capacity._0_4_);
        }
        (__return_storage_ptr__->m_errorMessage)._M_string_length =
             CONCAT44(local_e8._M_string_length._4_4_,(int)local_e8._M_string_length);
      }
      iVar7 = 1;
    }
LAB_00145470:
  } while (iVar7 == 0);
  local_180.parser = (ParserBase *)&PTR__BasicResult_001b2450;
  if (local_140 != &local_130) {
    operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
  }
  local_180.parser = (ParserBase *)&PTR__ResultValueBase_001b24a8;
  if (((ResultType)local_180.count == 0) && (local_158 != (pointer)0x0)) {
    operator_delete(local_158,(long)local_148 - (long)local_158);
  }
  if (local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<ParserInfo,_std::allocator<ParserInfo>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult
        Parser::parse( std::string const& exeName,
                       Detail::TokenStream tokens ) const {

            struct ParserInfo {
                ParserBase const* parser = nullptr;
                size_t count = 0;
            };
            std::vector<ParserInfo> parseInfos;
            parseInfos.reserve( m_options.size() + m_args.size() );
            for ( auto const& opt : m_options ) {
                parseInfos.push_back( { &opt, 0 } );
            }
            for ( auto const& arg : m_args ) {
                parseInfos.push_back( { &arg, 0 } );
            }

            m_exeName.set( exeName );

            auto result = Detail::InternalParseResult::ok(
                Detail::ParseState( ParseResultType::NoMatch, CATCH_MOVE(tokens) ) );
            while ( result.value().remainingTokens() ) {
                bool tokenParsed = false;

                for ( auto& parseInfo : parseInfos ) {
                    if ( parseInfo.parser->cardinality() == 0 ||
                         parseInfo.count < parseInfo.parser->cardinality() ) {
                        result = parseInfo.parser->parse(
                            exeName, CATCH_MOVE(result).value().remainingTokens() );
                        if ( !result )
                            return result;
                        if ( result.value().type() !=
                             ParseResultType::NoMatch ) {
                            tokenParsed = true;
                            ++parseInfo.count;
                            break;
                        }
                    }
                }

                if ( result.value().type() == ParseResultType::ShortCircuitAll )
                    return result;
                if ( !tokenParsed )
                    return Detail::InternalParseResult::runtimeError(
                        "Unrecognised token: " +
                        result.value().remainingTokens()->token );
            }
            // !TBD Check missing required options
            return result;
        }